

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridWavelet.cpp
# Opt level: O2

void __thiscall
TasGrid::GridWavelet::evaluateGpuMixed(GridWavelet *this,double *x,int num_x,double *y)

{
  Data2D<double> weights;
  Data2D<double> local_50;
  
  loadGpuCoefficients<double>(this);
  Data2D<double>::Data2D<int,int>
            (&local_50,(this->super_BaseCanonicalGrid).points.cache_num_indexes,num_x);
  (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0x20])
            (this,x,(ulong)(uint)num_x,
             local_50.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start);
  TasGpu::denseMultiplyMixed<double>
            ((this->super_BaseCanonicalGrid).acceleration,
             (this->super_BaseCanonicalGrid).num_outputs,num_x,
             (this->super_BaseCanonicalGrid).points.cache_num_indexes,1.0,
             &((this->gpu_cache)._M_t.
               super___uniq_ptr_impl<TasGrid::CudaWaveletData<double>,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_TasGrid::CudaWaveletData<double>_*,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
               .super__Head_base<0UL,_TasGrid::CudaWaveletData<double>_*,_false>._M_head_impl)->
              coefficients,
             local_50.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,0.0,y);
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_50.vec.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void GridWavelet::evaluateGpuMixed(const double x[], int num_x, double y[]) const{
    loadGpuCoefficients<double>();

    Data2D<double> weights(points.getNumIndexes(), num_x);
    evaluateHierarchicalFunctions(x, num_x, weights.getStrip(0));

    TasGpu::denseMultiplyMixed(acceleration, num_outputs, num_x, points.getNumIndexes(), 1.0, gpu_cache->coefficients, weights.data(), 0.0, y);
}